

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O3

string * __thiscall helics::BrokerApp::getIdentifier_abi_cxx11_(BrokerApp *this)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (getIdentifier[abi:cxx11]()::estring_abi_cxx11_ == '\0') {
    getIdentifier_abi_cxx11_();
  }
  peVar1 = (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (*peVar1->_vptr_Broker[0xb])();
    return (string *)CONCAT44(extraout_var,iVar2);
  }
  return &getIdentifier[abi:cxx11]()::estring_abi_cxx11_;
}

Assistant:

const std::string& BrokerApp::getIdentifier() const
{
    static const std::string estring;
    return (broker) ? broker->getIdentifier() : estring;
}